

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O2

void av1_first_pass_row(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,int unit_row,
                       BLOCK_SIZE fp_block_size)

{
  undefined1 *puVar1;
  buf_2d *pbVar2;
  uint8_t uVar3;
  byte bVar4;
  byte bVar5;
  _Bool _Var6;
  uint8_t uVar7;
  byte bVar8;
  aom_bit_depth_t aVar9;
  SequenceHeader *pSVar10;
  YV12_BUFFER_CONFIG *src;
  MB_MODE_INFO **ppMVar11;
  byte *input;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  uint uVar16;
  MV MVar17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [14];
  undefined1 auVar22 [16];
  CommonModeInfoParams *mi_params;
  BLOCK_SIZE BVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  FULLPEL_MV FVar27;
  long lVar28;
  RefCntBuffer *pRVar29;
  _func_void_uint16_t_ptr_ptrdiff_t_uint16_t_ptr_ptrdiff_t_int_int **pp_Var30;
  int64_t iVar31;
  short sVar32;
  int iVar33;
  int mi_row;
  uint16_t *puVar34;
  SequenceHeader *pSVar35;
  uint uVar36;
  MB_MODE_INFO *pMVar37;
  int iVar38;
  BLOCK_SIZE fp_block_size_00;
  int iVar39;
  tran_low_t **pptVar40;
  uint16_t *puVar41;
  byte bVar42;
  int iVar43;
  undefined7 in_register_00000081;
  long lVar44;
  byte bVar45;
  int iVar46;
  bool bVar47;
  uint uVar48;
  int iVar49;
  FULLPEL_MV FVar50;
  ulong uVar51;
  int iVar52;
  double dVar53;
  ushort uVar54;
  short sVar55;
  short sVar61;
  short sVar62;
  double dVar56;
  short sVar64;
  undefined1 auVar57 [16];
  short sVar63;
  undefined1 auVar58 [16];
  MV local_180;
  FULLPEL_MV tmp_mv;
  long local_178;
  FRAME_STATS *local_170;
  int motion_error;
  FULLPEL_MV mv;
  long local_150;
  int tmp_err;
  TileDataEnc *local_130;
  int local_128;
  uint local_124;
  int local_120;
  uint local_11c;
  int local_118;
  MV local_114;
  YV12_BUFFER_CONFIG *local_110;
  YV12_BUFFER_CONFIG *local_108;
  MACROBLOCKD *local_100;
  SequenceHeader *local_f8;
  buf_2d *local_f0;
  undefined1 local_e8 [16];
  ulong local_d0;
  RefCntBuffer *local_c8;
  buf_2d *local_c0;
  uint local_b4;
  uint local_b0;
  int local_ac;
  int local_a8;
  uint local_a4;
  int local_a0;
  int local_9c;
  ulong local_98;
  AV1_COMMON *local_90;
  ulong local_88;
  long local_80;
  CommonModeInfoParams *local_78;
  ulong local_70;
  AV1EncRowMultiThreadSync *local_68;
  ulong local_60;
  int *local_58;
  buf_2d unscaled_last_source_buf_2d;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  
  uVar51 = CONCAT71(in_register_00000081,fp_block_size) & 0xffffffff;
  pSVar10 = (cpi->common).seq_params;
  uVar3 = pSVar10->monochrome;
  iVar24 = find_fp_qindex(pSVar10->bit_depth);
  local_d0 = (ulong)block_size_high[uVar51];
  bVar4 = block_size_wide[uVar51];
  bVar5 = ""[uVar51];
  local_124 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [uVar51];
  iVar38 = ((cpi->common).mi_params.mb_cols << 2) / (int)local_124;
  iVar33 = (tile_data->tile_info).mi_row_start >> (bVar5 & 0x1f);
  local_98 = (ulong)(uint)((tile_data->tile_info).mi_col_start >> (""[uVar51] & 0x1f));
  local_130 = tile_data;
  local_128 = av1_get_unit_cols_in_tile(&tile_data->tile_info,(BLOCK_SIZE)uVar51);
  local_110 = av1_get_scaled_ref_frame(cpi,1);
  if (local_110 == (YV12_BUFFER_CONFIG *)0x0) {
    lVar28 = (long)(cpi->common).remapped_ref_idx[0];
    if (lVar28 == -1) {
      pRVar29 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar29 = (cpi->common).ref_frame_map[lVar28];
    }
    local_110 = &pRVar29->buf;
    if (pRVar29 == (RefCntBuffer *)0x0) {
      local_110 = (YV12_BUFFER_CONFIG *)0x0;
    }
  }
  uVar36 = (uint)(uVar3 == '\0') * 2 + 1;
  local_108 = av1_get_scaled_ref_frame(cpi,4);
  if (local_108 == (YV12_BUFFER_CONFIG *)0x0) {
    lVar28 = (long)(cpi->common).remapped_ref_idx[3];
    if (lVar28 == -1) {
      pRVar29 = (RefCntBuffer *)0x0;
    }
    else {
      pRVar29 = (cpi->common).ref_frame_map[lVar28];
    }
    local_108 = &pRVar29->buf;
    if (pRVar29 == (RefCntBuffer *)0x0) {
      local_108 = (YV12_BUFFER_CONFIG *)0x0;
    }
  }
  local_90 = &cpi->common;
  local_78 = &(cpi->common).mi_params;
  local_118 = unit_row - iVar33;
  local_68 = &local_130->row_mt_sync;
  local_c8 = (cpi->common).cur_frame;
  local_170 = (cpi->firstpass_data).mb_stats;
  lVar28 = (long)(iVar38 * unit_row);
  pptVar40 = td->firstpass_ctx->coeff;
  local_58 = (cpi->firstpass_data).raw_motion_err_list + lVar28 + (int)local_98;
  for (lVar44 = 0; (ulong)uVar36 * 0x11 - lVar44 != 0; lVar44 = lVar44 + 0x11) {
    (&(td->mb).plane[0].coeff)[lVar44] = *pptVar40;
    (&(td->mb).plane[0].qcoeff)[lVar44] = pptVar40[3];
    (&(td->mb).plane[0].eobs)[lVar44] = (uint16_t *)pptVar40[9];
    (&(td->mb).plane[0].txb_entropy_ctx)[lVar44] = (uint8_t *)pptVar40[0xc];
    (&(td->mb).plane[0].dqcoeff)[lVar44] = pptVar40[6];
    pptVar40 = pptVar40 + 1;
  }
  local_170 = local_170 + lVar28 + (int)local_98;
  src = cpi->source;
  uVar48 = (uint)(bVar4 >> ((local_c8->buf).field_1.field_0.uv_height <
                           (local_c8->buf).field_1.field_0.y_height));
  local_88 = (ulong)uVar48;
  iVar38 = (local_c8->buf).field_4.field_0.y_stride;
  iVar39 = (src->field_4).field_0.y_stride;
  iVar46 = (local_c8->buf).field_4.field_0.uv_stride;
  (td->mb).e_mbd.up_available = unit_row != iVar33;
  iVar49 = (int)local_d0 * (int)local_98;
  mi_row = unit_row << (bVar5 & 0x1f);
  iVar52 = iVar46 * unit_row + (int)local_98;
  iVar33 = (cpi->oxcf).border_in_pixels;
  iVar43 = 8 - (iVar33 + mi_row * 4);
  iVar46 = (mi_row + (uint)(bVar4 >> 2)) * -4 + -8;
  if (iVar46 < iVar43) {
    iVar46 = iVar43;
  }
  (td->mb).mv_limits.row_min = iVar46;
  iVar43 = (cpi->common).mi_params.mi_rows - mi_row;
  iVar46 = iVar33 + (iVar43 - (uint)(bVar4 >> 2)) * 4 + -8;
  iVar33 = iVar43 * 4 + 8;
  if (iVar46 < iVar33) {
    iVar33 = iVar46;
  }
  (td->mb).mv_limits.row_max = iVar33;
  local_11c = (uint)CONCAT71(in_register_00000081,fp_block_size) & 0xff;
  av1_setup_src_planes(&td->mb,src,mi_row,(local_130->tile_info).mi_col_start,uVar36,fp_block_size);
  memset((td->mb).plane[0].src_diff,0,0x200);
  local_100 = &(td->mb).e_mbd;
  uVar36 = local_124 * unit_row;
  local_a0 = uVar36 * -0x20;
  local_b0 = uVar36 - 1;
  local_a4 = (uint)(iVar24 == 0);
  local_f0 = &(td->mb).plane[0].src;
  local_b4 = (uint)((byte)(local_d0 >> 3) & 0x1f);
  local_c0 = (td->mb).e_mbd.plane[0].pre;
  local_60 = (ulong)(bVar4 >> 2);
  local_150 = (long)(int)(iVar38 * (uint)bVar4 * unit_row + iVar49);
  local_80 = (long)(int)(iVar49 + (uint)bVar4 * unit_row * iVar39);
  local_178 = (long)(int)(iVar52 * uVar48);
  local_9c = local_128;
  if (local_128 < 1) {
    local_9c = 0;
  }
  local_e8 = ZEXT816(0);
  uVar51 = 0;
  local_120 = 0;
  do {
    iVar24 = (int)uVar51;
    if (iVar24 == local_9c) {
      return;
    }
    (*(cpi->mt_info).enc_row_mt.sync_read_ptr)(local_68,local_118,iVar24);
    if (1 < (cpi->ppi->p_mt_info).num_workers) {
      pthread_mutex_lock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
      _Var6 = (cpi->mt_info).enc_row_mt.firstpass_mt_exit;
      pthread_mutex_unlock((pthread_mutex_t *)(cpi->mt_info).enc_row_mt.mutex_);
      if (_Var6 != false) {
        return;
      }
    }
    mi_params = local_78;
    if (iVar24 == 0) {
      local_180 = local_130->firstpass_top_mv;
    }
    iVar24 = iVar24 + (int)local_98;
    local_f8 = (cpi->common).seq_params;
    uVar7 = local_f8->monochrome;
    local_70 = uVar51;
    BVar23 = get_bsize(local_78,(BLOCK_SIZE)local_11c,unit_row,iVar24);
    uVar48 = iVar24 * local_124;
    set_mi_offsets(mi_params,local_100,uVar36,uVar48);
    pSVar10 = local_f8;
    (td->mb).e_mbd.plane[0].dst.buf = (local_c8->buf).field_5.buffers[0] + local_150;
    if (uVar7 == '\0') {
      (td->mb).e_mbd.plane[1].dst.buf = (local_c8->buf).field_5.buffers[1] + local_178;
      (td->mb).e_mbd.plane[2].dst.buf = (local_c8->buf).field_5.buffers[2] + local_178;
    }
    pMVar37 = *(td->mb).e_mbd.mi;
    pMVar37->bsize = BVar23;
    pMVar37->ref_frame[0] = '\0';
    uVar51 = (ulong)BVar23;
    bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[uVar51];
    bVar8 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[uVar51];
    iVar33 = (cpi->common).mi_params.mi_rows;
    iVar38 = (cpi->common).mi_params.mi_cols;
    (td->mb).e_mbd.mb_to_top_edge = local_a0;
    (td->mb).e_mbd.mb_to_bottom_edge = ((iVar33 - uVar36) - (uint)bVar5) * 0x20;
    (td->mb).e_mbd.mb_to_left_edge = uVar48 * -0x20;
    (td->mb).e_mbd.mb_to_right_edge = (iVar38 - (bVar8 + uVar48)) * 0x20;
    (td->mb).e_mbd.mi_row = uVar36;
    (td->mb).e_mbd.mi_col = uVar48;
    iVar33 = (local_130->tile_info).mi_row_start;
    (td->mb).e_mbd.up_available = iVar33 < (int)uVar36;
    uVar25 = (td->mb).e_mbd.plane[1].subsampling_x;
    uVar26 = (td->mb).e_mbd.plane[1].subsampling_y;
    iVar38 = (local_130->tile_info).mi_col_start;
    (td->mb).e_mbd.chroma_up_available = iVar33 < (int)uVar36;
    (td->mb).e_mbd.left_available = iVar38 < (int)uVar48;
    bVar47 = iVar38 < (int)(uVar48 - 1);
    if (uVar25 == 0) {
      bVar47 = iVar38 < (int)uVar48;
    }
    if ((0x3efffcUL >> (uVar51 & 0x3f) & 1) != 0) {
      bVar47 = iVar38 < (int)uVar48;
    }
    (td->mb).e_mbd.chroma_left_available = bVar47;
    uVar16 = uVar36;
    if ((0x20005UL >> (uVar51 & 0x3f) & 1) != 0 && uVar26 != 0) {
      (td->mb).e_mbd.chroma_up_available = iVar33 < (int)local_b0;
      uVar16 = local_b0;
    }
    if (iVar33 < (int)uVar36) {
      pMVar37 = (td->mb).e_mbd.mi[-(long)(td->mb).e_mbd.mi_stride];
    }
    else {
      pMVar37 = (MB_MODE_INFO *)0x0;
    }
    (td->mb).e_mbd.above_mbmi = pMVar37;
    if (iVar38 < (int)uVar48) {
      pMVar37 = (td->mb).e_mbd.mi[-1];
    }
    else {
      pMVar37 = (MB_MODE_INFO *)0x0;
    }
    (td->mb).e_mbd.left_mbmi = pMVar37;
    if (((uVar36 & 1) == 0) && ((bVar5 & uVar26 != 0) != 0)) {
      (td->mb).e_mbd.is_chroma_ref = false;
    }
    else {
      if (((uVar48 & 1) == 0) && ((bVar8 & 1) != 0)) {
        (td->mb).e_mbd.is_chroma_ref = uVar25 == 0;
        if (uVar25 != 0) goto LAB_001b63a2;
      }
      else {
        (td->mb).e_mbd.is_chroma_ref = true;
      }
      iVar38 = (td->mb).e_mbd.mi_stride;
      iVar39 = (uVar25 & uVar48) + (uVar26 & uVar36) * iVar38;
      ppMVar11 = (td->mb).e_mbd.mi;
      if (iVar33 < (int)uVar16) {
        pMVar37 = ppMVar11[(long)-iVar39 + (long)(int)(uVar25 - iVar38)];
      }
      else {
        pMVar37 = (MB_MODE_INFO *)0x0;
      }
      (td->mb).e_mbd.chroma_above_mbmi = pMVar37;
      if (bVar47 == false) {
        pMVar37 = (MB_MODE_INFO *)0x0;
      }
      else {
        pMVar37 = ppMVar11[(long)-iVar39 + (long)(int)(iVar38 * uVar26) + -1];
      }
      (td->mb).e_mbd.chroma_left_mbmi = pMVar37;
    }
LAB_001b63a2:
    (td->mb).e_mbd.height = bVar5;
    (td->mb).e_mbd.width = bVar8;
    (td->mb).e_mbd.is_last_vertical_rect = false;
    if ((bVar8 < bVar5) && ((bVar8 + uVar48 & bVar5 - 1) == 0)) {
      (td->mb).e_mbd.is_last_vertical_rect = true;
    }
    (td->mb).e_mbd.is_first_horizontal_rect = false;
    if ((bVar5 < bVar8) && ((bVar8 - 1 & uVar36) == 0)) {
      (td->mb).e_mbd.is_first_horizontal_rect = true;
    }
    lVar28 = 0xa30;
    if (uVar7 == '\0') {
      lVar28 = 0x1e90;
    }
    for (lVar44 = 0; lVar28 != lVar44; lVar44 = lVar44 + 0xa30) {
      bVar42 = (byte)(((uint)bVar5 << 2) >>
                     (*(byte *)((long)((td->mb).e_mbd.plane[0].pre + -2) + 0x18 + lVar44) & 0x1f));
      bVar45 = (byte)(((uint)bVar8 << 2) >>
                     (*(byte *)((long)((td->mb).e_mbd.plane[0].pre + -2) + 0x14 + lVar44) & 0x1f));
      if (bVar45 < 5) {
        bVar45 = 4;
      }
      *(byte *)((long)((td->mb).e_mbd.plane[0].seg_iqmatrix + -1) + lVar44 + 0x90) = bVar45;
      if (bVar42 < 5) {
        bVar42 = 4;
      }
      *(byte *)((long)((td->mb).e_mbd.plane[0].seg_iqmatrix + -1) + lVar44 + 0x91) = bVar42;
    }
    puVar1 = &(*(td->mb).e_mbd.mi)->field_0xa7;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfff8;
    pMVar37 = *(td->mb).e_mbd.mi;
    (td->mb).e_mbd.lossless[*(ushort *)&pMVar37->field_0xa7 & 7] = local_a4;
    pMVar37->mode = '\0';
    pMVar37->tx_size = '\0';
    if ((cpi->sf).fp_sf.disable_recon == 0) {
      av1_encode_intra_block_plane(cpi,&td->mb,BVar23,0,'\x01','\0');
    }
    else {
      iVar33 = (td->mb).e_mbd.plane[0].dst.stride;
      puVar41 = (uint16_t *)(td->mb).plane[0].src.buf;
      puVar34 = (uint16_t *)(td->mb).e_mbd.plane[0].dst.buf;
      iVar38 = (td->mb).plane[0].src.stride;
      unscaled_last_source_buf_2d.buf = (uint8_t *)local_f8;
      unscaled_last_source_buf_2d.buf0 = (uint8_t *)td;
      av1_foreach_transformed_block_in_plane
                (local_100,
                 av1_ss_size_lookup[uVar51][(td->mb).e_mbd.plane[0].subsampling_x]
                 [(td->mb).e_mbd.plane[0].subsampling_y],0,first_pass_intra_pred_and_calc_diff,
                 &unscaled_last_source_buf_2d);
      if (pSVar10->use_highbitdepth == '\0') {
        pp_Var30 = (_func_void_uint16_t_ptr_ptrdiff_t_uint16_t_ptr_ptrdiff_t_int_int **)
                   &aom_convolve_copy;
      }
      else {
        puVar41 = (uint16_t *)((long)puVar41 * 2);
        puVar34 = (uint16_t *)((long)puVar34 * 2);
        pp_Var30 = &aom_highbd_convolve_copy;
      }
      (**pp_Var30)(puVar41,(long)iVar38,puVar34,(long)iVar33,(uint)block_size_wide[uVar51],
                   (uint)block_size_high[uVar51]);
    }
    uVar25 = aom_get_mb_ss_sse2((td->mb).plane[0].src_diff);
    pSVar10 = local_f8;
    if ((local_f8->use_highbitdepth == '\0') || (aVar9 = local_f8->bit_depth, aVar9 == AOM_BITS_8))
    {
LAB_001b65d4:
      if ((int)uVar25 < 0x32) {
        local_170->intra_skip_count = local_170->intra_skip_count + 1;
      }
      else if ((0 < iVar24) && (local_170->image_data_start_row == -1)) {
        local_170->image_data_start_row = unit_row;
      }
      dVar53 = log1p((double)(int)uVar25);
      if (10.0 <= dVar53) {
        dVar56 = local_170->intra_factor + 1.0;
      }
      else {
        dVar56 = (10.0 - dVar53) * 0.05 + 1.0 + local_170->intra_factor;
      }
      local_170->intra_factor = dVar56;
      input = local_f0->buf;
      if (pSVar10->use_highbitdepth == '\0') {
        uVar26 = (uint)*input;
      }
      else {
        uVar54 = *(ushort *)((long)input * 2);
        uVar26 = (uint)uVar54;
        aVar9 = pSVar10->bit_depth;
        if (aVar9 != AOM_BITS_8) {
          if (aVar9 == AOM_BITS_12) {
            uVar26 = (uint)(uVar54 >> 4);
          }
          else {
            pSVar35 = (SequenceHeader *)0xffffffffffffffff;
            if (aVar9 != AOM_BITS_10) goto LAB_001b6720;
            uVar26 = (uint)(uVar54 >> 2);
          }
        }
      }
      if ((9.0 <= dVar53) || (0x3f < uVar26)) {
        dVar53 = local_170->brightness_factor + 1.0;
      }
      else {
        dVar53 = (double)(int)(0x40 - uVar26) * 0.01 + 1.0 + local_170->brightness_factor;
      }
      local_170->brightness_factor = dVar53;
      local_170->intra_error = (long)(int)uVar25 + local_170->intra_error + 0x400;
      if ((cpi->oxcf).q_cfg.deltaq_mode == '\x02') {
        iVar31 = av1_haar_ac_sad_mxn_uint8_input
                           (input,(td->mb).plane[0].src.stride,
                            (uint)((td->mb).e_mbd.cur_buf)->flags >> 3 & 1,local_b4,
                            (uint)(bVar4 >> 3));
        local_170->frame_avg_wavelet_energy = local_170->frame_avg_wavelet_energy + iVar31;
      }
      else {
        local_170->frame_avg_wavelet_energy = -1;
      }
      pSVar35 = (SequenceHeader *)(ulong)(uVar25 + 0x400);
    }
    else {
      if (aVar9 == AOM_BITS_12) {
        uVar25 = (int)uVar25 >> 8;
        goto LAB_001b65d4;
      }
      pSVar35 = (SequenceHeader *)0xffffffff;
      if (aVar9 == AOM_BITS_10) {
        uVar25 = (int)uVar25 >> 4;
        goto LAB_001b65d4;
      }
    }
LAB_001b6720:
    auVar57 = local_e8;
    if (((local_90->current_frame).frame_type & 0xfd) == 0) {
      iVar24 = (int)pSVar35;
      auVar57._0_8_ = (long)iVar24;
      auVar57._8_4_ = iVar24;
      auVar57._12_4_ = iVar24 >> 0x1f;
      local_170->coded_error = auVar57._0_8_ + local_170->coded_error;
      local_170->sr_coded_error = auVar57._8_8_ + local_170->sr_coded_error;
      iVar33 = (int)local_70;
    }
    else {
      local_114.row = local_e8._0_2_;
      local_114.col = local_e8._2_2_;
      uVar25 = (uint)((td->mb).e_mbd.cur_buf)->flags >> 3 & 1;
      iVar33 = (td->mb).e_mbd.bd;
      fp_block_size_00 = (BLOCK_SIZE)local_11c;
      local_f8 = pSVar35;
      local_e8 = auVar57;
      BVar23 = get_bsize(local_78,fp_block_size_00,unit_row,iVar24);
      local_ac = get_unit_rows(fp_block_size_00,(cpi->common).mi_params.mb_rows);
      local_a8 = get_unit_cols(fp_block_size_00,(cpi->common).mi_params.mb_cols);
      pbVar2 = local_f0;
      mv.row = 0;
      mv.col = 0;
      (td->mb).e_mbd.plane[0].pre[0].buf = (local_110->field_5).buffers[0] + local_150;
      iVar38 = (cpi->oxcf).border_in_pixels;
      iVar46 = 8 - (iVar38 + uVar48 * 4);
      iVar39 = (uVar48 + (int)local_60) * -4 + -8;
      if (iVar39 < iVar46) {
        iVar39 = iVar46;
      }
      (td->mb).mv_limits.col_min = iVar39;
      iVar46 = (cpi->common).mi_params.mi_cols - uVar48;
      iVar39 = iVar46 * 4 + 8;
      iVar38 = iVar38 + (iVar46 - (int)local_60) * 4 + -8;
      if (iVar38 < iVar39) {
        iVar39 = iVar38;
      }
      (td->mb).mv_limits.col_max = iVar39;
      motion_error = get_prediction_error_bitdepth(uVar25,iVar33,BVar23,local_f0,local_c0);
      unscaled_last_source_buf_2d.buf = (cpi->unscaled_last_source->field_5).buffers[0] + local_80;
      unscaled_last_source_buf_2d.stride = (cpi->unscaled_last_source->field_4).field_0.y_stride;
      local_e8._0_4_ = iVar33;
      iVar33 = get_prediction_error_bitdepth
                         (uVar25,iVar33,BVar23,pbVar2,&unscaled_last_source_buf_2d);
      local_58[local_120] = iVar33;
      if ((((cpi->sf).fp_sf.skip_motion_search_threshold < iVar33) &&
          (first_pass_motion_search(cpi,&td->mb,&local_114,&mv,&motion_error),
          (cpi->sf).fp_sf.skip_zeromv_motion_search == 0)) && (local_114 != (MV)0x0)) {
        tmp_mv.row = 0;
        tmp_mv.col = 0;
        tmp_err = 0x7fffffff;
        first_pass_motion_search(cpi,&td->mb,&kZeroMv,&tmp_mv,&tmp_err);
        if (tmp_err < motion_error) {
          motion_error = tmp_err;
          mv = tmp_mv;
        }
      }
      iVar38 = motion_error;
      FVar50 = SUB84(local_f8,0);
      FVar27 = (FULLPEL_MV)motion_error;
      if ((local_108 != (YV12_BUFFER_CONFIG *)0x0) && (1 < (cpi->common).current_frame.frame_number)
         ) {
        av1_setup_pre_planes(local_100,0,local_108,0,0,(scale_factors *)0x0,1);
        pbVar2 = (td->mb).e_mbd.plane[0].pre;
        pbVar2->buf = pbVar2->buf + local_150;
        tmp_mv = (FULLPEL_MV)
                 get_prediction_error_bitdepth(uVar25,local_e8._0_4_,BVar23,local_f0,local_c0);
        first_pass_motion_search(cpi,&td->mb,&kZeroMv,(FULLPEL_MV *)&tmp_err,(int *)&tmp_mv);
        FVar27 = tmp_mv;
        if (((int)tmp_mv < iVar38) && ((int)tmp_mv < (int)FVar50)) {
          local_170->second_ref_count = local_170->second_ref_count + 1;
        }
      }
      if ((int)FVar50 <= (int)FVar27) {
        FVar27 = FVar50;
      }
      if ((cpi->common).current_frame.frame_number < 2) {
        FVar27 = (FULLPEL_MV)iVar38;
      }
      if (local_108 == (YV12_BUFFER_CONFIG *)0x0) {
        FVar27 = (FULLPEL_MV)iVar38;
      }
      local_170->sr_coded_error = local_170->sr_coded_error + (long)(int)FVar27;
      local_c0->buf = (local_110->field_5).buffers[0] + local_150;
      if (((cpi->common).seq_params)->monochrome == '\0') {
        (td->mb).e_mbd.plane[1].pre[0].buf = (local_110->field_5).buffers[1] + local_178;
        (td->mb).e_mbd.plane[2].pre[0].buf = (local_110->field_5).buffers[2] + local_178;
      }
      local_e8 = (undefined1  [16])0x0;
      iVar33 = (int)local_70;
      if (iVar38 <= (int)FVar50) {
        if (((int)FVar50 < 0x800) && ((int)FVar50 * 9 + -0x2400 <= iVar38 * 10)) {
          dVar53 = local_170->neutral_count + 1.0;
LAB_001b6b2a:
          local_170->neutral_count = dVar53;
        }
        else if ((0x2000 < (int)FVar50) && ((int)FVar50 < iVar38 * 3)) {
          dVar53 = (double)iVar38 / ((double)(int)FVar50 + 1e-06) + local_170->neutral_count;
          goto LAB_001b6b2a;
        }
        local_e8 = psllw(ZEXT416((uint)mv),3);
        MVar17 = local_e8._0_4_;
        pMVar37 = *(td->mb).e_mbd.mi;
        pMVar37->mode = '\x10';
        pMVar37->mv[0].as_int = (uint32_t)MVar17;
        pMVar37 = *(td->mb).e_mbd.mi;
        pMVar37->tx_size = '\0';
        pMVar37->ref_frame[0] = '\x01';
        (*(td->mb).e_mbd.mi)->ref_frame[1] = -1;
        if ((cpi->sf).fp_sf.disable_recon == 0) {
          av1_enc_build_inter_predictor
                    (local_90,local_100,uVar36,uVar48,(BUFFER_SET *)0x0,BVar23,0,0);
          av1_encode_sby_pass1(cpi,&td->mb,BVar23);
        }
        sVar55 = local_e8._0_2_;
        sVar32 = -sVar55;
        sVar61 = local_e8._2_2_;
        sVar12 = -sVar61;
        sVar62 = local_e8._4_2_;
        sVar13 = -sVar62;
        sVar63 = local_e8._6_2_;
        sVar14 = -sVar63;
        sVar64 = local_e8._8_2_;
        sVar15 = -sVar64;
        uVar54 = (ushort)(sVar14 < sVar63) * sVar63 | (ushort)(sVar14 >= sVar63) * sVar14;
        auVar20._2_2_ = (ushort)(sVar15 < sVar64) * sVar64 | (ushort)(sVar15 >= sVar64) * sVar15;
        auVar20._0_2_ = uVar54;
        auVar60._0_12_ = local_e8._0_12_;
        auVar60._12_2_ = sVar63;
        auVar60._14_2_ = sVar63;
        auVar59._12_4_ = auVar60._12_4_;
        auVar59._0_10_ = local_e8._0_10_;
        auVar59._10_2_ = sVar62;
        auVar58._10_6_ = auVar59._10_6_;
        auVar58._0_8_ = local_e8._0_8_;
        auVar58._8_2_ = sVar62;
        auVar18._4_8_ = auVar58._8_8_;
        auVar18._2_2_ = sVar61;
        auVar18._0_2_ = sVar61;
        iVar39 = (int)sVar55;
        iVar46 = auVar18._0_4_ >> 0x10;
        auVar20._4_8_ = 0;
        auVar21._12_2_ = uVar54;
        auVar21._0_12_ = auVar20 << 0x30;
        auVar22._8_8_ = 0;
        auVar22._0_8_ =
             CONCAT44(auVar21._10_4_,
                      CONCAT22((ushort)(sVar13 < sVar62) * sVar62 |
                               (ushort)(sVar13 >= sVar62) * sVar13,uVar54)) >> 0x10;
        auVar19._2_10_ = SUB1610(auVar22 << 0x40,6);
        auVar19._0_2_ = (ushort)(sVar12 < sVar61) * sVar61 | (ushort)(sVar12 >= sVar61) * sVar12;
        local_170->sum_mvr = iVar39 + local_170->sum_mvr;
        local_170->sum_mvc = iVar46 + local_170->sum_mvc;
        local_170->sum_mvr_abs =
             (uint)(ushort)((ushort)(sVar32 < sVar55) * sVar55 | (ushort)(sVar32 >= sVar55) * sVar32
                           ) + local_170->sum_mvr_abs;
        local_170->sum_mvc_abs = auVar19._0_4_ + local_170->sum_mvc_abs;
        local_170->sum_mvrs = local_170->sum_mvrs + (ulong)(uint)(iVar39 * iVar39);
        local_170->sum_mvcs = local_170->sum_mvcs + (ulong)(uint)(iVar46 * iVar46);
        local_170->inter_count = local_170->inter_count + 1;
        FVar50 = (FULLPEL_MV)iVar38;
        if (MVar17 != (MV)0x0) {
          local_170->mv_count = local_170->mv_count + 1;
          if (local_180 != MVar17) {
            local_170->new_mv_count = local_170->new_mv_count + 1;
          }
          sVar32 = mv.row;
          if (unit_row < local_ac / 2) {
            iVar38 = -1;
            if (sVar32 < 1) {
              iVar38 = 1;
LAB_001b6c81:
              if (-1 < sVar32) goto LAB_001b6c87;
            }
LAB_001b6c84:
            local_170->sum_in_vectors = local_170->sum_in_vectors + iVar38;
          }
          else if (local_ac / 2 < unit_row) {
            iVar38 = 1;
            if (sVar32 < 1) {
              iVar38 = -1;
              goto LAB_001b6c81;
            }
            goto LAB_001b6c84;
          }
LAB_001b6c87:
          iVar38 = (int)mv >> 0x10;
          local_180 = MVar17;
          if (iVar24 < local_a8 / 2) {
            iVar24 = -1;
            if (iVar38 < 1) {
              iVar24 = 1;
LAB_001b6cb3:
              if (-1 < iVar38) goto LAB_001b6cb9;
            }
          }
          else {
            if (iVar24 <= local_a8 / 2) goto LAB_001b6cb9;
            iVar24 = 1;
            if (iVar38 < 1) {
              iVar24 = -1;
              goto LAB_001b6cb3;
            }
          }
          local_170->sum_in_vectors = local_170->sum_in_vectors + iVar24;
        }
      }
LAB_001b6cb9:
      if (iVar33 == 0) {
        local_130->firstpass_top_mv = local_180;
      }
      local_170->coded_error = local_170->coded_error + (long)(int)FVar50;
      local_120 = local_120 + 1;
    }
    local_f0->buf = local_f0->buf + local_d0;
    if (uVar3 == '\0') {
      pbVar2 = &(td->mb).plane[1].src;
      pbVar2->buf = pbVar2->buf + local_88;
      pbVar2 = &(td->mb).plane[2].src;
      pbVar2->buf = pbVar2->buf + local_88;
    }
    local_150 = local_150 + local_d0;
    local_80 = local_80 + local_d0;
    local_178 = local_178 + local_88;
    local_170 = local_170 + 1;
    (*(cpi->mt_info).enc_row_mt.sync_write_ptr)(local_68,local_118,iVar33,local_128);
    uVar51 = (ulong)(iVar33 + 1);
  } while( true );
}

Assistant:

void av1_first_pass_row(AV1_COMP *cpi, ThreadData *td, TileDataEnc *tile_data,
                        const int unit_row, const BLOCK_SIZE fp_block_size) {
  MACROBLOCK *const x = &td->mb;
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const SequenceHeader *const seq_params = cm->seq_params;
  const int num_planes = av1_num_planes(cm);
  MACROBLOCKD *const xd = &x->e_mbd;
  TileInfo *tile = &tile_data->tile_info;
  const int qindex = find_fp_qindex(seq_params->bit_depth);
  const int fp_block_size_width = block_size_high[fp_block_size];
  const int fp_block_size_height = block_size_wide[fp_block_size];
  const int unit_width = mi_size_wide[fp_block_size];
  const int unit_width_log2 = mi_size_wide_log2[fp_block_size];
  const int unit_height_log2 = mi_size_high_log2[fp_block_size];
  const int unit_cols = mi_params->mb_cols * 4 / unit_width;
  int raw_motion_err_counts = 0;
  int unit_row_in_tile = unit_row - (tile->mi_row_start >> unit_height_log2);
  int unit_col_start = tile->mi_col_start >> unit_width_log2;
  int unit_cols_in_tile = av1_get_unit_cols_in_tile(tile, fp_block_size);
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &mt_info->enc_row_mt;
  AV1EncRowMultiThreadSync *const row_mt_sync = &tile_data->row_mt_sync;

  const YV12_BUFFER_CONFIG *last_frame =
      av1_get_scaled_ref_frame(cpi, LAST_FRAME);
  if (!last_frame) {
    last_frame = get_ref_frame_yv12_buf(cm, LAST_FRAME);
  }
  const YV12_BUFFER_CONFIG *golden_frame =
      av1_get_scaled_ref_frame(cpi, GOLDEN_FRAME);
  if (!golden_frame) {
    golden_frame = get_ref_frame_yv12_buf(cm, GOLDEN_FRAME);
  }
  YV12_BUFFER_CONFIG *const this_frame = &cm->cur_frame->buf;

  PICK_MODE_CONTEXT *ctx = td->firstpass_ctx;
  FRAME_STATS *mb_stats =
      cpi->firstpass_data.mb_stats + unit_row * unit_cols + unit_col_start;
  int *raw_motion_err_list = cpi->firstpass_data.raw_motion_err_list +
                             unit_row * unit_cols + unit_col_start;
  MV *first_top_mv = &tile_data->firstpass_top_mv;

  for (int i = 0; i < num_planes; ++i) {
    x->plane[i].coeff = ctx->coeff[i];
    x->plane[i].qcoeff = ctx->qcoeff[i];
    x->plane[i].eobs = ctx->eobs[i];
    x->plane[i].txb_entropy_ctx = ctx->txb_entropy_ctx[i];
    x->plane[i].dqcoeff = ctx->dqcoeff[i];
  }

  const int src_y_stride = cpi->source->y_stride;
  const int recon_y_stride = this_frame->y_stride;
  const int recon_uv_stride = this_frame->uv_stride;
  const int uv_mb_height =
      fp_block_size_height >> (this_frame->y_height > this_frame->uv_height);

  MV best_ref_mv = kZeroMv;
  MV last_mv;

  // Reset above block coeffs.
  xd->up_available = (unit_row_in_tile != 0);
  int recon_yoffset = (unit_row * recon_y_stride * fp_block_size_height) +
                      (unit_col_start * fp_block_size_width);
  int src_yoffset = (unit_row * src_y_stride * fp_block_size_height) +
                    (unit_col_start * fp_block_size_width);
  int recon_uvoffset = (unit_row * recon_uv_stride * uv_mb_height) +
                       (unit_col_start * uv_mb_height);

  // Set up limit values for motion vectors to prevent them extending
  // outside the UMV borders.
  av1_set_mv_row_limits(
      mi_params, &x->mv_limits, (unit_row << unit_height_log2),
      (fp_block_size_height >> MI_SIZE_LOG2), cpi->oxcf.border_in_pixels);

  av1_setup_src_planes(x, cpi->source, unit_row << unit_height_log2,
                       tile->mi_col_start, num_planes, fp_block_size);

  // Fix - zero the 16x16 block first. This ensures correct this_intra_error for
  // block sizes smaller than 16x16.
  av1_zero_array(x->plane[0].src_diff, 256);

  for (int unit_col_in_tile = 0; unit_col_in_tile < unit_cols_in_tile;
       unit_col_in_tile++) {
    const int unit_col = unit_col_start + unit_col_in_tile;

    enc_row_mt->sync_read_ptr(row_mt_sync, unit_row_in_tile, unit_col_in_tile);

#if CONFIG_MULTITHREAD
    if (cpi->ppi->p_mt_info.num_workers > 1) {
      pthread_mutex_lock(enc_row_mt->mutex_);
      bool firstpass_mt_exit = enc_row_mt->firstpass_mt_exit;
      pthread_mutex_unlock(enc_row_mt->mutex_);
      // Exit in case any worker has encountered an error.
      if (firstpass_mt_exit) return;
    }
#endif

    if (unit_col_in_tile == 0) {
      last_mv = *first_top_mv;
    }
    int this_intra_error = firstpass_intra_prediction(
        cpi, td, this_frame, tile, unit_row, unit_col, recon_yoffset,
        recon_uvoffset, fp_block_size, qindex, mb_stats);

    if (!frame_is_intra_only(cm)) {
      const int this_inter_error = firstpass_inter_prediction(
          cpi, td, last_frame, golden_frame, unit_row, unit_col, recon_yoffset,
          recon_uvoffset, src_yoffset, fp_block_size, this_intra_error,
          raw_motion_err_counts, raw_motion_err_list, best_ref_mv, &best_ref_mv,
          &last_mv, mb_stats);
      if (unit_col_in_tile == 0) {
        *first_top_mv = last_mv;
      }
      mb_stats->coded_error += this_inter_error;
      ++raw_motion_err_counts;
    } else {
      mb_stats->sr_coded_error += this_intra_error;
      mb_stats->coded_error += this_intra_error;
    }

    // Adjust to the next column of MBs.
    x->plane[0].src.buf += fp_block_size_width;
    if (num_planes > 1) {
      x->plane[1].src.buf += uv_mb_height;
      x->plane[2].src.buf += uv_mb_height;
    }

    recon_yoffset += fp_block_size_width;
    src_yoffset += fp_block_size_width;
    recon_uvoffset += uv_mb_height;
    mb_stats++;

    enc_row_mt->sync_write_ptr(row_mt_sync, unit_row_in_tile, unit_col_in_tile,
                               unit_cols_in_tile);
  }
}